

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::ReadError::ReadError
          (ReadError *this,CStringRef filename,int line,int column,CStringRef format_str,
          ArgList args)

{
  EVP_PKEY_CTX *in_RSI;
  ReadError *in_RDI;
  Error *in_stack_ffffffffffffff80;
  
  Error::Error(in_stack_ffffffffffffff80);
  *(undefined ***)&(in_RDI->super_Error).super_RuntimeError = &PTR__ReadError_0097aef0;
  std::__cxx11::string::string((string *)&in_RDI->filename_);
  init(in_RDI,in_RSI);
  return;
}

Assistant:

ReadError(fmt::CStringRef filename, int line, int column,
            fmt::CStringRef format_str, fmt::ArgList args) {
    init(filename, line, column, format_str, args);
  }